

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O2

void __thiscall
sc_core::wif_sc_unsigned_trace::wif_sc_unsigned_trace
          (wif_sc_unsigned_trace *this,sc_unsigned *object_,string *name_,string *wif_name_)

{
  wif_trace::wif_trace(&this->super_wif_trace,name_,wif_name_);
  (this->super_wif_trace)._vptr_wif_trace = (_func_int **)&PTR_write_002654d0;
  this->object = object_;
  sc_dt::sc_unsigned::sc_unsigned(&this->old_value,object_->nbits + -1);
  sc_dt::sc_unsigned::operator=(&this->old_value,this->object);
  (this->super_wif_trace).wif_type = "BIT";
  return;
}

Assistant:

wif_sc_unsigned_trace::wif_sc_unsigned_trace(const sc_dt::sc_unsigned& object_,
					     const std::string& name_,
					     const std::string& wif_name_)
: wif_trace(name_, wif_name_), object(object_), old_value(object_.length())
{
    old_value = object;
    wif_type = "BIT";
}